

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUnate.c
# Opt level: O3

int Gia_ManCheckUnate_rec(Gia_Man_t *p,int iObj)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  iVar2 = p->nTravIds - p->pTravIds[iObj];
  if (3 < iVar2) {
    if ((iObj < 0) || (p->nObjs <= iObj)) {
      __assert_fail("v >= 0 && v < p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                    ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
    }
    pGVar1 = p->pObjs;
    p->pTravIds[iObj] = p->nTravIds + -3;
    iVar2 = 3;
    if ((~(uint)*(undefined8 *)(pGVar1 + (uint)iObj) & 0x9fffffff) != 0) {
      uVar3 = Gia_ManCheckUnate_rec
                        (p,iObj - ((uint)*(undefined8 *)(pGVar1 + (uint)iObj) & 0x1fffffff));
      uVar4 = Gia_ManCheckUnate_rec(p,iObj - (*(uint *)&pGVar1[(uint)iObj].field_0x4 & 0x1fffffff));
      uVar5 = uVar3;
      if ((uVar3 - 1 < 2) && (uVar5 = uVar3 ^ 3, (pGVar1[(uint)iObj].field_0x3 & 0x20) == 0)) {
        uVar5 = uVar3;
      }
      uVar3 = uVar4;
      if ((uVar4 - 1 < 2) && (uVar3 = uVar4 ^ 3, (pGVar1[(uint)iObj].field_0x7 & 0x20) == 0)) {
        uVar3 = uVar4;
      }
      iVar2 = p->nTravIds - (uVar3 & uVar5);
      p->pTravIds[iObj] = iVar2;
      if (3 < (int)(uVar3 & uVar5)) {
        __assert_fail("(Res0 & Res1) <= 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUnate.c"
                      ,0x87,"int Gia_ManCheckUnate_rec(Gia_Man_t *, int)");
      }
      iVar2 = p->nTravIds - iVar2;
    }
  }
  return iVar2;
}

Assistant:

int Gia_ManCheckUnate_rec( Gia_Man_t * p, int iObj )
{
    Gia_Obj_t * pObj;
    int Res0, Res1;
    if ( p->nTravIds - p->pTravIds[iObj] <= 3 )
        return p->nTravIds - p->pTravIds[iObj];
    pObj = Gia_ManObj( p, iObj );
    p->pTravIds[iObj] = p->nTravIds - 3;
    if ( Gia_ObjIsCi(pObj) )
        return 3;
    Res0 = Gia_ManCheckUnate_rec( p, Gia_ObjFaninId0(pObj, iObj) );
    Res1 = Gia_ManCheckUnate_rec( p, Gia_ObjFaninId1(pObj, iObj) );
    Res0 = ((Res0 == 1 || Res0 == 2) && Gia_ObjFaninC0(pObj)) ? Res0 ^ 3 : Res0;
    Res1 = ((Res1 == 1 || Res1 == 2) && Gia_ObjFaninC1(pObj)) ? Res1 ^ 3 : Res1;
    p->pTravIds[iObj] = p->nTravIds - (Res0 & Res1);
    assert( (Res0 & Res1) <= 3 );
    return p->nTravIds - p->pTravIds[iObj];
}